

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall
re2::Prog::SearchBitState
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int nsubmatch;
  bool bVar1;
  int iVar2;
  StringPiece *submatch;
  StringPiece *pSVar3;
  BitState b;
  StringPiece local_b0;
  BitState local_a0;
  
  local_b0.ptr_ = (char *)0x0;
  local_b0.length_ = 0;
  iVar2 = 1;
  if (1 < nmatch) {
    iVar2 = nmatch;
  }
  pSVar3 = match;
  if (nmatch < 1) {
    pSVar3 = &local_b0;
  }
  submatch = match;
  nsubmatch = nmatch;
  if (kind == kFullMatch) {
    submatch = pSVar3;
    nsubmatch = iVar2;
  }
  local_a0.text_.ptr_ = (char *)0x0;
  local_a0.text_.length_ = 0;
  local_a0.context_.ptr_ = (char *)0x0;
  local_a0.context_.length_ = 0;
  local_a0.anchored_ = false;
  local_a0.longest_ = false;
  local_a0.endmatch_ = false;
  local_a0.submatch_ = (StringPiece *)0x0;
  local_a0.nsubmatch_ = 0;
  local_a0.cap_ = (char **)0x0;
  local_a0.ncap_ = 0;
  local_a0.visited_ = (uint32 *)0x0;
  local_a0.nvisited_ = 0;
  local_a0.job_ = (Job *)0x0;
  local_a0.njob_ = 0;
  local_a0.maxjob_ = 0;
  local_a0.prog_ = this;
  bVar1 = BitState::Search(&local_a0,text,context,anchor == kAnchored || kind == kFullMatch,
                           kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch < 1) {
        match = &local_b0;
      }
      if (pSVar3->ptr_ + match->length_ != text->ptr_ + text->length_) goto LAB_0013342f;
    }
    bVar1 = true;
  }
  else {
LAB_0013342f:
    bVar1 = false;
  }
  BitState::~BitState(&local_a0);
  return bVar1;
}

Assistant:

bool Prog::SearchBitState(const StringPiece& text,
                          const StringPiece& context,
                          Anchor anchor,
                          MatchKind kind,
                          StringPiece* match,
                          int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  BitState b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}